

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error storeAtts(XML_Parser parser,ENCODING *enc,char *attStr,TAG_NAME *tagNamePtr,
                   BINDING **bindingsPtr)

{
  byte bVar1;
  STRING_POOL *pool;
  XML_Char XVar2;
  char cVar3;
  DTD *pDVar4;
  ATTRIBUTE *pAVar5;
  DEFAULT_ATTRIBUTE *pDVar6;
  undefined8 *puVar7;
  XML_Char *pXVar8;
  byte bVar9;
  byte bVar10;
  XML_Bool XVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  XML_Error XVar16;
  uint uVar17;
  int iVar18;
  ELEMENT_TYPE *elementType;
  XML_Char *pXVar19;
  ATTRIBUTE *pAVar20;
  ATTRIBUTE_ID *pAVar21;
  long lVar22;
  char *pcVar23;
  NS_ATT *pNVar24;
  unsigned_long uVar25;
  NAMED *pNVar26;
  size_t sVar27;
  uint64_t uVar28;
  BINDING *pBVar29;
  TAG *pTVar30;
  int iVar31;
  size_t len;
  unsigned_long uVar32;
  ulong uVar33;
  XML_Error XVar34;
  byte bVar35;
  NS_ATT *pNVar36;
  long lVar37;
  int oldAttsSize;
  ulong uVar38;
  char *pcVar39;
  bool bVar40;
  bool bVar41;
  siphash sip_state;
  siphash local_68;
  
  pDVar4 = parser->m_dtd;
  elementType = (ELEMENT_TYPE *)lookup(parser,&pDVar4->elementTypes,tagNamePtr->str,0);
  if (elementType == (ELEMENT_TYPE *)0x0) {
    pXVar19 = poolCopyString(&pDVar4->pool,tagNamePtr->str);
    if ((pXVar19 == (XML_Char *)0x0) ||
       (elementType = (ELEMENT_TYPE *)lookup(parser,&pDVar4->elementTypes,pXVar19,0x28),
       elementType == (ELEMENT_TYPE *)0x0)) {
      bVar40 = false;
      elementType = (ELEMENT_TYPE *)0x0;
    }
    else if ((parser->m_ns == '\0') ||
            (iVar12 = setElementTypePrefix(parser,elementType), iVar12 != 0)) {
      bVar40 = true;
    }
    else {
      bVar40 = false;
    }
    if (!bVar40) {
      return XML_ERROR_NO_MEMORY;
    }
  }
  uVar17 = elementType->nDefaultAtts;
  uVar13 = (*enc->getAtts)(enc,attStr,parser->m_attsSize,parser->m_atts);
  iVar14 = uVar13 + uVar17;
  iVar12 = parser->m_attsSize;
  if (iVar12 < iVar14) {
    parser->m_attsSize = iVar14 + 0x10;
    pAVar20 = (ATTRIBUTE *)
              (*(parser->m_mem).realloc_fcn)(parser->m_atts,(long)iVar14 * 0x20 + 0x200);
    if (pAVar20 == (ATTRIBUTE *)0x0) {
      parser->m_attsSize = iVar12;
    }
    else {
      parser->m_atts = pAVar20;
      if (iVar12 < (int)uVar13) {
        (*enc->getAtts)(enc,attStr,uVar13,pAVar20);
      }
    }
    if (pAVar20 == (ATTRIBUTE *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
  }
  pAVar20 = parser->m_atts;
  if ((int)uVar13 < 1) {
    XVar34 = XML_ERROR_NO_MEMORY;
    iVar14 = 0;
    iVar12 = 0;
  }
  else {
    uVar33 = 0;
    XVar34 = XML_ERROR_NO_MEMORY;
    iVar12 = 0;
    iVar14 = 0;
    do {
      pcVar23 = parser->m_atts[uVar33].name;
      iVar15 = (*enc->nameLength)(enc,pcVar23);
      pAVar21 = getAttributeId(parser,enc,pcVar23,pcVar23 + iVar15);
      iVar15 = iVar12;
      if (pAVar21 == (ATTRIBUTE_ID *)0x0) {
LAB_0040359c:
        bVar40 = false;
        XVar34 = XML_ERROR_NO_MEMORY;
        iVar12 = iVar15;
      }
      else if (pAVar21->name[-1] == '\0') {
        pAVar21->name[-1] = '\x01';
        iVar15 = iVar12 + 1;
        (&pAVar20->name)[iVar12] = pAVar21->name;
        pAVar5 = parser->m_atts;
        if (pAVar5[uVar33].normalized == '\0') {
          XVar11 = '\x01';
          if ((pAVar21->maybeTokenized != '\0') && (0 < (int)uVar17)) {
            lVar22 = 0;
            do {
              if (pAVar21 == *(ATTRIBUTE_ID **)((long)&elementType->defaultAtts->id + lVar22)) {
                XVar11 = (&elementType->defaultAtts->isCdata)[lVar22];
                break;
              }
              lVar22 = lVar22 + 0x18;
            } while ((ulong)uVar17 * 0x18 != lVar22);
          }
          XVar16 = storeAttributeValue(parser,enc,XVar11,pAVar5[uVar33].valuePtr,
                                       pAVar5[uVar33].valueEnd,&parser->m_tempPool);
          if (XVar16 != XML_ERROR_NONE) {
            bVar40 = false;
            XVar34 = XVar16;
            iVar12 = iVar15;
            goto LAB_004035a7;
          }
          (&pAVar20->name)[iVar15] = (parser->m_tempPool).start;
          (parser->m_tempPool).start = (parser->m_tempPool).ptr;
        }
        else {
          pXVar19 = poolStoreString(&parser->m_tempPool,enc,pAVar5[uVar33].valuePtr,
                                    pAVar5[uVar33].valueEnd);
          (&pAVar20->name)[iVar15] = pXVar19;
          if (pXVar19 == (XML_Char *)0x0) goto LAB_0040359c;
          (parser->m_tempPool).start = (parser->m_tempPool).ptr;
        }
        if (pAVar21->prefix == (PREFIX *)0x0) {
          bVar40 = true;
          iVar12 = iVar12 + 2;
        }
        else if (pAVar21->xmlns == '\0') {
          iVar14 = iVar14 + 1;
          pAVar21->name[-1] = '\x02';
          bVar40 = true;
          iVar12 = iVar12 + 2;
        }
        else {
          XVar16 = addBinding(parser,pAVar21->prefix,pAVar21,(&pAVar20->name)[iVar15],bindingsPtr);
          bVar40 = XVar16 == XML_ERROR_NONE;
          if (!bVar40) {
            XVar34 = XVar16;
            iVar12 = iVar15;
          }
        }
      }
      else {
        if (parser->m_encoding == enc) {
          parser->m_eventPtr = parser->m_atts[uVar33].name;
        }
        bVar40 = false;
        XVar34 = XML_ERROR_DUPLICATE_ATTRIBUTE;
      }
LAB_004035a7:
      if (!bVar40) {
        return XVar34;
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar13);
  }
  parser->m_nSpecifiedAtts = iVar12;
  lVar22 = 0xffffffff;
  if ((elementType->idAtt == (ATTRIBUTE_ID *)0x0) ||
     (pXVar19 = elementType->idAtt->name, pXVar19[-1] == '\0')) {
LAB_004037d5:
    parser->m_idAttIndex = (int)lVar22;
  }
  else if (0 < iVar12) {
    lVar22 = 0;
    do {
      if ((&pAVar20->name)[lVar22] == pXVar19) goto LAB_004037d5;
      lVar22 = lVar22 + 2;
    } while ((int)lVar22 < iVar12);
  }
  if (0 < (int)uVar17) {
    lVar22 = 0;
    do {
      pDVar6 = elementType->defaultAtts;
      pAVar21 = *(ATTRIBUTE_ID **)((long)&pDVar6->id + lVar22);
      pXVar19 = pAVar21->name;
      bVar40 = true;
      if ((pXVar19[-1] == '\0') &&
         (pXVar8 = *(XML_Char **)((long)&pDVar6->value + lVar22), pXVar8 != (XML_Char *)0x0)) {
        if (pAVar21->prefix == (PREFIX *)0x0) {
          pXVar19[-1] = '\x01';
          (&pAVar20->name)[iVar12] = (char *)**(undefined8 **)((long)&pDVar6->id + lVar22);
          pcVar23 = *(char **)((long)&pDVar6->value + lVar22);
        }
        else {
          if (pAVar21->xmlns != '\0') {
            XVar16 = addBinding(parser,pAVar21->prefix,pAVar21,pXVar8,bindingsPtr);
            bVar40 = XVar16 == XML_ERROR_NONE;
            if (!bVar40) {
              XVar34 = XVar16;
            }
            goto LAB_00403809;
          }
          pXVar19[-1] = '\x02';
          iVar14 = iVar14 + 1;
          (&pAVar20->name)[iVar12] = (char *)**(undefined8 **)((long)&pDVar6->id + lVar22);
          pcVar23 = *(char **)((long)&pDVar6->value + lVar22);
        }
        (&pAVar20->valuePtr)[iVar12] = pcVar23;
        iVar12 = iVar12 + 2;
      }
LAB_00403809:
      if (!bVar40) {
        return XVar34;
      }
      lVar22 = lVar22 + 0x18;
    } while ((ulong)uVar17 * 0x18 != lVar22);
  }
  (&pAVar20->name)[iVar12] = (char *)0x0;
  if (iVar14 == 0) {
    iVar15 = 0;
    goto LAB_00403ed5;
  }
  bVar35 = parser->m_nsAttsPower;
  iVar31 = 1 << (bVar35 & 0x1f);
  uVar32 = parser->m_nsAttsVersion;
  if (iVar14 * 2 >> (bVar35 & 0x1f) == 0) {
LAB_004039a8:
    if (uVar32 == 0) {
      uVar32 = 0xffffffff;
      lVar22 = (long)iVar31;
      pNVar24 = parser->m_nsAtts + lVar22;
      do {
        pNVar24 = pNVar24 + -1;
        pNVar24->version = 0xffffffff;
        lVar22 = lVar22 + -1;
      } while (lVar22 != 0);
    }
    uVar32 = uVar32 - 1;
    parser->m_nsAttsVersion = uVar32;
    if (iVar12 < 1) {
      iVar15 = 0;
    }
    else {
      pool = &parser->m_tempPool;
      uVar17 = iVar31 - 1;
      iVar15 = 0;
      do {
        pcVar23 = (&pAVar20->name)[iVar15];
        if (pcVar23[-1] == '\x02') {
          uVar25 = get_hash_secret_salt(parser);
          local_68.v0 = 0x736f6d6570736575;
          local_68.v1 = uVar25 ^ 0x646f72616e646f6d;
          local_68.v2 = 0x6c7967656e657261;
          local_68.v3 = uVar25 ^ 0x7465646279746573;
          local_68.p = local_68.buf;
          local_68.c = 0;
          pcVar23[-1] = '\0';
          pNVar26 = lookup(parser,&pDVar4->attributeIds,pcVar23,0);
          if ((pNVar26 == (NAMED *)0x0) || (pNVar26[1].name == (KEY)0x0)) {
            XVar34 = XML_ERROR_NO_MEMORY;
          }
          else {
            puVar7 = *(undefined8 **)(pNVar26[1].name + 8);
            if (puVar7 == (undefined8 *)0x0) {
              XVar34 = XML_ERROR_UNBOUND_PREFIX;
            }
            else {
              iVar18 = *(int *)(puVar7 + 5);
              if (0 < iVar18) {
                lVar22 = 0;
                do {
                  XVar2 = *(XML_Char *)(puVar7[4] + lVar22);
                  if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
                     (XVar11 = poolGrow(pool), XVar11 == '\0')) {
                    XVar34 = XML_ERROR_NO_MEMORY;
                    bVar40 = false;
                  }
                  else {
                    pXVar19 = (parser->m_tempPool).ptr;
                    (parser->m_tempPool).ptr = pXVar19 + 1;
                    *pXVar19 = XVar2;
                    bVar40 = true;
                  }
                  if (!bVar40) goto LAB_00403e74;
                  lVar22 = lVar22 + 1;
                  iVar18 = *(int *)(puVar7 + 5);
                } while (lVar22 < iVar18);
              }
              sip24_update(&local_68,(void *)puVar7[4],(long)iVar18);
              do {
                pcVar39 = pcVar23;
                pcVar23 = pcVar39 + 1;
              } while (*pcVar39 != ':');
              if (*pcVar23 == '\0') {
                len = 0;
              }
              else {
                sVar27 = 0;
                do {
                  len = sVar27 + 1;
                  lVar22 = sVar27 + 2;
                  sVar27 = len;
                } while (pcVar39[lVar22] != '\0');
              }
              sip24_update(&local_68,pcVar23,len);
              do {
                if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
                   (XVar11 = poolGrow(pool), XVar11 == '\0')) {
                  XVar34 = XML_ERROR_NO_MEMORY;
                  goto LAB_00403e74;
                }
                cVar3 = *pcVar23;
                pcVar39 = (parser->m_tempPool).ptr;
                (parser->m_tempPool).ptr = pcVar39 + 1;
                *pcVar39 = cVar3;
                cVar3 = *pcVar23;
                pcVar23 = pcVar23 + 1;
              } while (cVar3 != '\0');
              uVar28 = sip24_final(&local_68);
              uVar13 = uVar17 & (uint)uVar28;
              pNVar24 = parser->m_nsAtts;
              lVar22 = (long)(int)uVar13;
              bVar40 = pNVar24[lVar22].version == uVar32;
              if (bVar40) {
                pNVar36 = pNVar24 + lVar22;
                bVar35 = 0;
                do {
                  if (uVar28 == pNVar36->hash) {
                    pcVar23 = (parser->m_tempPool).start;
                    cVar3 = *pcVar23;
                    bVar41 = cVar3 == '\0';
                    if ((!bVar41) && (cVar3 == *pNVar36->uriName)) {
                      lVar37 = 1;
                      do {
                        cVar3 = pcVar23[lVar37];
                        bVar41 = cVar3 == '\0';
                        if (bVar41) break;
                        pcVar39 = pNVar36->uriName + lVar37;
                        lVar37 = lVar37 + 1;
                      } while (cVar3 == *pcVar39);
                    }
                    if (bVar41) {
                      XVar34 = XML_ERROR_DUPLICATE_ATTRIBUTE;
                      break;
                    }
                  }
                  if (bVar35 == 0) {
                    bVar35 = (byte)((uVar28 & ~(long)(int)uVar17) >>
                                   ((char)*(undefined4 *)&parser->m_nsAttsPower - 1U & 0x3f)) &
                             (byte)((ulong)(long)(int)uVar17 >> 2) | 1;
                  }
                  iVar18 = 0;
                  if ((int)uVar13 < (int)(uint)bVar35) {
                    iVar18 = iVar31;
                  }
                  uVar13 = (uVar13 - bVar35) + iVar18;
                  lVar22 = (long)(int)uVar13;
                  pNVar36 = pNVar24 + lVar22;
                  bVar40 = pNVar36->version == uVar32;
                } while (bVar40);
              }
              if (!bVar40) {
                if (parser->m_ns_triplets != '\0') {
                  (parser->m_tempPool).ptr[-1] = parser->m_namespaceSeparator;
                  pcVar23 = *(char **)*puVar7;
                  do {
                    if (((parser->m_tempPool).ptr == (parser->m_tempPool).end) &&
                       (XVar11 = poolGrow(pool), XVar11 == '\0')) {
                      XVar34 = XML_ERROR_NO_MEMORY;
                      goto LAB_00403e74;
                    }
                    cVar3 = *pcVar23;
                    pcVar39 = (parser->m_tempPool).ptr;
                    (parser->m_tempPool).ptr = pcVar39 + 1;
                    *pcVar39 = cVar3;
                    cVar3 = *pcVar23;
                    pcVar23 = pcVar23 + 1;
                  } while (cVar3 != '\0');
                }
                pcVar23 = (parser->m_tempPool).start;
                (parser->m_tempPool).start = (parser->m_tempPool).ptr;
                (&pAVar20->name)[iVar15] = pcVar23;
                pNVar24 = parser->m_nsAtts;
                pNVar24[lVar22].version = uVar32;
                pNVar24[lVar22].hash = uVar28;
                pNVar24[lVar22].uriName = pcVar23;
                iVar18 = 0;
                iVar14 = iVar14 + -1;
                if (iVar14 == 0) {
                  iVar15 = iVar15 + 2;
                  iVar14 = 0;
                  iVar18 = 0x12;
                }
                goto LAB_00403e79;
              }
            }
          }
LAB_00403e74:
          iVar18 = 1;
        }
        else {
          pcVar23[-1] = '\0';
          iVar18 = 0;
        }
LAB_00403e79:
        if (iVar18 != 0) {
          bVar40 = true;
          if (iVar18 != 0x12) {
            bVar40 = false;
          }
          goto LAB_00403eca;
        }
        iVar15 = iVar15 + 2;
      } while (iVar15 < iVar12);
    }
    bVar40 = true;
  }
  else {
    bVar10 = parser->m_nsAttsPower;
    do {
      bVar1 = bVar10 + 1;
      bVar9 = bVar10 & 0x1f;
      bVar10 = bVar1;
    } while (iVar14 >> bVar9 != 0);
    bVar10 = 3;
    if (3 < bVar1) {
      bVar10 = bVar1;
    }
    parser->m_nsAttsPower = bVar10;
    iVar31 = 1 << (bVar10 & 0x1f);
    pNVar24 = (NS_ATT *)(*(parser->m_mem).realloc_fcn)(parser->m_nsAtts,(long)iVar31 * 0x18);
    if (pNVar24 != (NS_ATT *)0x0) {
      parser->m_nsAtts = pNVar24;
      uVar32 = 0;
      goto LAB_004039a8;
    }
    parser->m_nsAttsPower = bVar35;
    XVar34 = XML_ERROR_NO_MEMORY;
    bVar40 = false;
    iVar15 = 0;
  }
LAB_00403eca:
  if (!bVar40) {
    return XVar34;
  }
LAB_00403ed5:
  if (iVar15 < iVar12) {
    lVar22 = (long)iVar15;
    do {
      (&pAVar20->name)[lVar22][-1] = '\0';
      lVar22 = lVar22 + 2;
    } while (lVar22 < iVar12);
  }
  for (pBVar29 = *bindingsPtr; pBVar29 != (BINDING *)0x0; pBVar29 = pBVar29->nextTagBinding) {
    pBVar29->attId->name[-1] = '\0';
  }
  if (parser->m_ns != '\0') {
    if (elementType->prefix == (PREFIX *)0x0) {
      pBVar29 = (pDVar4->defaultPrefix).binding;
      if (pBVar29 == (BINDING *)0x0) {
        return XML_ERROR_NONE;
      }
      pcVar23 = tagNamePtr->str;
    }
    else {
      pBVar29 = elementType->prefix->binding;
      if (pBVar29 == (BINDING *)0x0) {
        return XML_ERROR_UNBOUND_PREFIX;
      }
      pcVar23 = tagNamePtr->str;
      do {
        cVar3 = *pcVar23;
        pcVar23 = pcVar23 + 1;
      } while (cVar3 != ':');
    }
    lVar22 = 0;
    if ((parser->m_ns_triplets != '\0') &&
       (pXVar19 = pBVar29->prefix->name, pXVar19 != (XML_Char *)0x0)) {
      lVar22 = 0;
      do {
        pcVar39 = pXVar19 + lVar22;
        lVar22 = lVar22 + 1;
      } while (*pcVar39 != '\0');
    }
    tagNamePtr->localPart = pcVar23;
    iVar12 = pBVar29->uriLen;
    tagNamePtr->uriLen = iVar12;
    tagNamePtr->prefix = pBVar29->prefix->name;
    iVar14 = (int)lVar22;
    tagNamePtr->prefixLen = iVar14;
    uVar33 = 0;
    do {
      uVar38 = uVar33;
      uVar33 = uVar38 + 1;
    } while (pcVar23[uVar38] != '\0');
    iVar12 = iVar12 + iVar14;
    if (pBVar29->uriAlloc < (int)uVar33 + iVar12) {
      iVar12 = iVar12 + (int)uVar33 + 0x18;
      pXVar19 = (XML_Char *)(*(parser->m_mem).malloc_fcn)((long)iVar12);
      if (pXVar19 == (XML_Char *)0x0) {
        XVar34 = XML_ERROR_NO_MEMORY;
      }
      else {
        pBVar29->uriAlloc = iVar12;
        memcpy(pXVar19,pBVar29->uri,(long)pBVar29->uriLen);
        pTVar30 = parser->m_tagStack;
        if (pTVar30 != (TAG *)0x0) {
          pXVar8 = pBVar29->uri;
          do {
            if ((pTVar30->name).str == pXVar8) {
              (pTVar30->name).str = pXVar19;
            }
            pTVar30 = pTVar30->parent;
          } while (pTVar30 != (tag *)0x0);
        }
        (*(parser->m_mem).free_fcn)(pBVar29->uri);
        pBVar29->uri = pXVar19;
      }
      if (pXVar19 == (XML_Char *)0x0) {
        return XVar34;
      }
    }
    pXVar19 = pBVar29->uri + pBVar29->uriLen;
    memcpy(pXVar19,pcVar23,uVar33 & 0xffffffff);
    if (iVar14 != 0) {
      pXVar19[uVar38] = parser->m_namespaceSeparator;
      memcpy(pXVar19 + uVar33,pBVar29->prefix->name,(long)iVar14);
    }
    tagNamePtr->str = pBVar29->uri;
  }
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error
storeAtts(XML_Parser parser, const ENCODING *enc,
          const char *attStr, TAG_NAME *tagNamePtr,
          BINDING **bindingsPtr)
{
  DTD * const dtd = parser->m_dtd;  /* save one level of indirection */
  ELEMENT_TYPE *elementType;
  int nDefaultAtts;
  const XML_Char **appAtts;   /* the attribute list for the application */
  int attIndex = 0;
  int prefixLen;
  int i;
  int n;
  XML_Char *uri;
  int nPrefixes = 0;
  BINDING *binding;
  const XML_Char *localPart;

  /* lookup the element type name */
  elementType = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, tagNamePtr->str,0);
  if (!elementType) {
    const XML_Char *name = poolCopyString(&dtd->pool, tagNamePtr->str);
    if (!name)
      return XML_ERROR_NO_MEMORY;
    elementType = (ELEMENT_TYPE *)lookup(parser, &dtd->elementTypes, name,
                                         sizeof(ELEMENT_TYPE));
    if (!elementType)
      return XML_ERROR_NO_MEMORY;
    if (parser->m_ns && !setElementTypePrefix(parser, elementType))
      return XML_ERROR_NO_MEMORY;
  }
  nDefaultAtts = elementType->nDefaultAtts;

  /* get the attributes from the tokenizer */
  n = XmlGetAttributes(enc, attStr, parser->m_attsSize, parser->m_atts);
  if (n + nDefaultAtts > parser->m_attsSize) {
    int oldAttsSize = parser->m_attsSize;
    ATTRIBUTE *temp;
#ifdef XML_ATTR_INFO
    XML_AttrInfo *temp2;
#endif
    parser->m_attsSize = n + nDefaultAtts + INIT_ATTS_SIZE;
    temp = (ATTRIBUTE *)REALLOC(parser, (void *)parser->m_atts, parser->m_attsSize * sizeof(ATTRIBUTE));
    if (temp == NULL) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_atts = temp;
#ifdef XML_ATTR_INFO
    temp2 = (XML_AttrInfo *)REALLOC(parser, (void *)parser->m_attInfo, parser->m_attsSize * sizeof(XML_AttrInfo));
    if (temp2 == NULL) {
      parser->m_attsSize = oldAttsSize;
      return XML_ERROR_NO_MEMORY;
    }
    parser->m_attInfo = temp2;
#endif
    if (n > oldAttsSize)
      XmlGetAttributes(enc, attStr, n, parser->m_atts);
  }

  appAtts = (const XML_Char **)parser->m_atts;
  for (i = 0; i < n; i++) {
    ATTRIBUTE *currAtt = &parser->m_atts[i];
#ifdef XML_ATTR_INFO
    XML_AttrInfo *currAttInfo = &parser->m_attInfo[i];
#endif
    /* add the name and value to the attribute list */
    ATTRIBUTE_ID *attId = getAttributeId(parser, enc, currAtt->name,
                                         currAtt->name
                                         + XmlNameLength(enc, currAtt->name));
    if (!attId)
      return XML_ERROR_NO_MEMORY;
#ifdef XML_ATTR_INFO
    currAttInfo->nameStart = parser->m_parseEndByteIndex - (parser->m_parseEndPtr - currAtt->name);
    currAttInfo->nameEnd = currAttInfo->nameStart +
                           XmlNameLength(enc, currAtt->name);
    currAttInfo->valueStart = parser->m_parseEndByteIndex -
                            (parser->m_parseEndPtr - currAtt->valuePtr);
    currAttInfo->valueEnd = parser->m_parseEndByteIndex - (parser->m_parseEndPtr - currAtt->valueEnd);
#endif
    /* Detect duplicate attributes by their QNames. This does not work when
       namespace processing is turned on and different prefixes for the same
       namespace are used. For this case we have a check further down.
    */
    if ((attId->name)[-1]) {
      if (enc == parser->m_encoding)
        parser->m_eventPtr = parser->m_atts[i].name;
      return XML_ERROR_DUPLICATE_ATTRIBUTE;
    }
    (attId->name)[-1] = 1;
    appAtts[attIndex++] = attId->name;
    if (!parser->m_atts[i].normalized) {
      enum XML_Error result;
      XML_Bool isCdata = XML_TRUE;

      /* figure out whether declared as other than CDATA */
      if (attId->maybeTokenized) {
        int j;
        for (j = 0; j < nDefaultAtts; j++) {
          if (attId == elementType->defaultAtts[j].id) {
            isCdata = elementType->defaultAtts[j].isCdata;
            break;
          }
        }
      }

      /* normalize the attribute value */
      result = storeAttributeValue(parser, enc, isCdata,
                                   parser->m_atts[i].valuePtr, parser->m_atts[i].valueEnd,
                                   &parser->m_tempPool);
      if (result)
        return result;
      appAtts[attIndex] = poolStart(&parser->m_tempPool);
      poolFinish(&parser->m_tempPool);
    }
    else {
      /* the value did not need normalizing */
      appAtts[attIndex] = poolStoreString(&parser->m_tempPool, enc, parser->m_atts[i].valuePtr,
                                          parser->m_atts[i].valueEnd);
      if (appAtts[attIndex] == 0)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&parser->m_tempPool);
    }
    /* handle prefixed attribute names */
    if (attId->prefix) {
      if (attId->xmlns) {
        /* deal with namespace declarations here */
        enum XML_Error result = addBinding(parser, attId->prefix, attId,
                                           appAtts[attIndex], bindingsPtr);
        if (result)
          return result;
        --attIndex;
      }
      else {
        /* deal with other prefixed names later */
        attIndex++;
        nPrefixes++;
        (attId->name)[-1] = 2;
      }
    }
    else
      attIndex++;
  }

  /* set-up for XML_GetSpecifiedAttributeCount and XML_GetIdAttributeIndex */
  parser->m_nSpecifiedAtts = attIndex;
  if (elementType->idAtt && (elementType->idAtt->name)[-1]) {
    for (i = 0; i < attIndex; i += 2)
      if (appAtts[i] == elementType->idAtt->name) {
        parser->m_idAttIndex = i;
        break;
      }
  }
  else
    parser->m_idAttIndex = -1;

  /* do attribute defaulting */
  for (i = 0; i < nDefaultAtts; i++) {
    const DEFAULT_ATTRIBUTE *da = elementType->defaultAtts + i;
    if (!(da->id->name)[-1] && da->value) {
      if (da->id->prefix) {
        if (da->id->xmlns) {
          enum XML_Error result = addBinding(parser, da->id->prefix, da->id,
                                             da->value, bindingsPtr);
          if (result)
            return result;
        }
        else {
          (da->id->name)[-1] = 2;
          nPrefixes++;
          appAtts[attIndex++] = da->id->name;
          appAtts[attIndex++] = da->value;
        }
      }
      else {
        (da->id->name)[-1] = 1;
        appAtts[attIndex++] = da->id->name;
        appAtts[attIndex++] = da->value;
      }
    }
  }
  appAtts[attIndex] = 0;

  /* expand prefixed attribute names, check for duplicates,
     and clear flags that say whether attributes were specified */
  i = 0;
  if (nPrefixes) {
    int j;  /* hash table index */
    unsigned long version = parser->m_nsAttsVersion;
    int nsAttsSize = (int)1 << parser->m_nsAttsPower;
    unsigned char oldNsAttsPower = parser->m_nsAttsPower;
    /* size of hash table must be at least 2 * (# of prefixed attributes) */
    if ((nPrefixes << 1) >> parser->m_nsAttsPower) {  /* true for m_nsAttsPower = 0 */
      NS_ATT *temp;
      /* hash table size must also be a power of 2 and >= 8 */
      while (nPrefixes >> parser->m_nsAttsPower++);
      if (parser->m_nsAttsPower < 3)
        parser->m_nsAttsPower = 3;
      nsAttsSize = (int)1 << parser->m_nsAttsPower;
      temp = (NS_ATT *)REALLOC(parser, parser->m_nsAtts, nsAttsSize * sizeof(NS_ATT));
      if (!temp) {
        /* Restore actual size of memory in m_nsAtts */
        parser->m_nsAttsPower = oldNsAttsPower;
        return XML_ERROR_NO_MEMORY;
      }
      parser->m_nsAtts = temp;
      version = 0;  /* force re-initialization of m_nsAtts hash table */
    }
    /* using a version flag saves us from initializing m_nsAtts every time */
    if (!version) {  /* initialize version flags when version wraps around */
      version = INIT_ATTS_VERSION;
      for (j = nsAttsSize; j != 0; )
        parser->m_nsAtts[--j].version = version;
    }
    parser->m_nsAttsVersion = --version;

    /* expand prefixed names and check for duplicates */
    for (; i < attIndex; i += 2) {
      const XML_Char *s = appAtts[i];
      if (s[-1] == 2) {  /* prefixed */
        ATTRIBUTE_ID *id;
        const BINDING *b;
        unsigned long uriHash;
        struct siphash sip_state;
        struct sipkey sip_key;

        copy_salt_to_sipkey(parser, &sip_key);
        sip24_init(&sip_state, &sip_key);

        ((XML_Char *)s)[-1] = 0;  /* clear flag */
        id = (ATTRIBUTE_ID *)lookup(parser, &dtd->attributeIds, s, 0);
        if (!id || !id->prefix) {
          /* This code is walking through the appAtts array, dealing
           * with (in this case) a prefixed attribute name.  To be in
           * the array, the attribute must have already been bound, so
           * has to have passed through the hash table lookup once
           * already.  That implies that an entry for it already
           * exists, so the lookup above will return a pointer to
           * already allocated memory.  There is no opportunaity for
           * the allocator to fail, so the condition above cannot be
           * fulfilled.
           *
           * Since it is difficult to be certain that the above
           * analysis is complete, we retain the test and merely
           * remove the code from coverage tests.
           */
          return XML_ERROR_NO_MEMORY; /* LCOV_EXCL_LINE */
        }
        b = id->prefix->binding;
        if (!b)
          return XML_ERROR_UNBOUND_PREFIX;

        for (j = 0; j < b->uriLen; j++) {
          const XML_Char c = b->uri[j];
          if (!poolAppendChar(&parser->m_tempPool, c))
            return XML_ERROR_NO_MEMORY;
        }

        sip24_update(&sip_state, b->uri, b->uriLen * sizeof(XML_Char));

        while (*s++ != XML_T(ASCII_COLON))
          ;

        sip24_update(&sip_state, s, keylen(s) * sizeof(XML_Char));

        do {  /* copies null terminator */
          if (!poolAppendChar(&parser->m_tempPool, *s))
            return XML_ERROR_NO_MEMORY;
        } while (*s++);

        uriHash = (unsigned long)sip24_final(&sip_state);

        { /* Check hash table for duplicate of expanded name (uriName).
             Derived from code in lookup(parser, HASH_TABLE *table, ...).
          */
          unsigned char step = 0;
          unsigned long mask = nsAttsSize - 1;
          j = uriHash & mask;  /* index into hash table */
          while (parser->m_nsAtts[j].version == version) {
            /* for speed we compare stored hash values first */
            if (uriHash == parser->m_nsAtts[j].hash) {
              const XML_Char *s1 = poolStart(&parser->m_tempPool);
              const XML_Char *s2 = parser->m_nsAtts[j].uriName;
              /* s1 is null terminated, but not s2 */
              for (; *s1 == *s2 && *s1 != 0; s1++, s2++);
              if (*s1 == 0)
                return XML_ERROR_DUPLICATE_ATTRIBUTE;
            }
            if (!step)
              step = PROBE_STEP(uriHash, mask, parser->m_nsAttsPower);
            j < step ? (j += nsAttsSize - step) : (j -= step);
          }
        }

        if (parser->m_ns_triplets) {  /* append namespace separator and prefix */
          parser->m_tempPool.ptr[-1] = parser->m_namespaceSeparator;
          s = b->prefix->name;
          do {
            if (!poolAppendChar(&parser->m_tempPool, *s))
              return XML_ERROR_NO_MEMORY;
          } while (*s++);
        }

        /* store expanded name in attribute list */
        s = poolStart(&parser->m_tempPool);
        poolFinish(&parser->m_tempPool);
        appAtts[i] = s;

        /* fill empty slot with new version, uriName and hash value */
        parser->m_nsAtts[j].version = version;
        parser->m_nsAtts[j].hash = uriHash;
        parser->m_nsAtts[j].uriName = s;

        if (!--nPrefixes) {
          i += 2;
          break;
        }
      }
      else  /* not prefixed */
        ((XML_Char *)s)[-1] = 0;  /* clear flag */
    }
  }
  /* clear flags for the remaining attributes */
  for (; i < attIndex; i += 2)
    ((XML_Char *)(appAtts[i]))[-1] = 0;
  for (binding = *bindingsPtr; binding; binding = binding->nextTagBinding)
    binding->attId->name[-1] = 0;

  if (!parser->m_ns)
    return XML_ERROR_NONE;

  /* expand the element type name */
  if (elementType->prefix) {
    binding = elementType->prefix->binding;
    if (!binding)
      return XML_ERROR_UNBOUND_PREFIX;
    localPart = tagNamePtr->str;
    while (*localPart++ != XML_T(ASCII_COLON))
      ;
  }
  else if (dtd->defaultPrefix.binding) {
    binding = dtd->defaultPrefix.binding;
    localPart = tagNamePtr->str;
  }
  else
    return XML_ERROR_NONE;
  prefixLen = 0;
  if (parser->m_ns_triplets && binding->prefix->name) {
    for (; binding->prefix->name[prefixLen++];)
      ;  /* prefixLen includes null terminator */
  }
  tagNamePtr->localPart = localPart;
  tagNamePtr->uriLen = binding->uriLen;
  tagNamePtr->prefix = binding->prefix->name;
  tagNamePtr->prefixLen = prefixLen;
  for (i = 0; localPart[i++];)
    ;  /* i includes null terminator */
  n = i + binding->uriLen + prefixLen;
  if (n > binding->uriAlloc) {
    TAG *p;
    uri = (XML_Char *)MALLOC(parser, (n + EXPAND_SPARE) * sizeof(XML_Char));
    if (!uri)
      return XML_ERROR_NO_MEMORY;
    binding->uriAlloc = n + EXPAND_SPARE;
    memcpy(uri, binding->uri, binding->uriLen * sizeof(XML_Char));
    for (p = parser->m_tagStack; p; p = p->parent)
      if (p->name.str == binding->uri)
        p->name.str = uri;
    FREE(parser, binding->uri);
    binding->uri = uri;
  }
  /* if m_namespaceSeparator != '\0' then uri includes it already */
  uri = binding->uri + binding->uriLen;
  memcpy(uri, localPart, i * sizeof(XML_Char));
  /* we always have a namespace separator between localPart and prefix */
  if (prefixLen) {
    uri += i - 1;
    *uri = parser->m_namespaceSeparator;  /* replace null terminator */
    memcpy(uri + 1, binding->prefix->name, prefixLen * sizeof(XML_Char));
  }
  tagNamePtr->str = binding->uri;
  return XML_ERROR_NONE;
}